

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O3

QSize __thiscall QWidgetItemV2::sizeHint(QWidgetItemV2 *this)

{
  int iVar1;
  QSize QVar2;
  ulong uVar3;
  
  iVar1 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[8])();
  if ((char)iVar1 == '\0') {
    if (*(QWidgetItemV2 **)(*(long *)&((this->super_QWidgetItem).wid)->field_0x8 + 0xb0) == this) {
      updateCacheIfNecessary(this);
      QVar2 = this->q_cachedSizeHint;
    }
    else {
      QVar2 = QWidgetItem::sizeHint(&this->super_QWidgetItem);
    }
    uVar3 = (ulong)QVar2 & 0xffffffff00000000;
  }
  else {
    uVar3 = 0;
    QVar2.wd.m_i = 0;
    QVar2.ht.m_i = 0;
  }
  return (QSize)((ulong)QVar2 & 0xffffffff | uVar3);
}

Assistant:

QSize QWidgetItemV2::sizeHint() const
{
    if (isEmpty())
        return QSize(0, 0);

    if (useSizeCache()) {
        updateCacheIfNecessary();
        return q_cachedSizeHint;
    } else {
        return QWidgetItem::sizeHint();
    }
}